

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

void start_tx_queue(ixgbe_device *dev,int queue_id)

{
  long lVar1;
  uint in_ESI;
  long in_RDI;
  ixgbe_tx_queue *queue;
  
  fprintf(_stderr,"[DEBUG] %s:%d %s(): starting tx queue %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
          0x138,"start_tx_queue",(ulong)in_ESI);
  lVar1 = *(long *)(in_RDI + 0x80) + (long)(int)in_ESI * 0x10;
  if ((*(ushort *)(lVar1 + 8) & *(short *)(lVar1 + 8) - 1U) != 0) {
    fprintf(_stderr,"[ERROR] %s:%d %s(): number of queue entries must be a power of 2\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",
            0x13b,"start_tx_queue");
    abort();
  }
  set_reg32(*(uint8_t **)(in_RDI + 0x70),in_ESI * 0x40 + 0x6010,0);
  set_reg32(*(uint8_t **)(in_RDI + 0x70),in_ESI * 0x40 + 0x6018,0);
  set_flags32((uint8_t *)queue,(int)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  wait_set_reg32((uint8_t *)queue,(int)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  return;
}

Assistant:

static void start_tx_queue(struct ixgbe_device* dev, int queue_id) {
	debug("starting tx queue %d", queue_id);
	struct ixgbe_tx_queue* queue = ((struct ixgbe_tx_queue*)(dev->tx_queues)) + queue_id;
	if (queue->num_entries & (queue->num_entries - 1)) {
		error("number of queue entries must be a power of 2");
	}
	// tx queue starts out empty
	set_reg32(dev->addr, IXGBE_TDH(queue_id), 0);
	set_reg32(dev->addr, IXGBE_TDT(queue_id), 0);
	// enable queue and wait if necessary
	set_flags32(dev->addr, IXGBE_TXDCTL(queue_id), IXGBE_TXDCTL_ENABLE);
	wait_set_reg32(dev->addr, IXGBE_TXDCTL(queue_id), IXGBE_TXDCTL_ENABLE);
}